

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O1

void quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
               (crcinfo *start,crcinfo *end,_func_bool_crcinfo_ptr_crcinfo_ptr *fun)

{
  crcinfo *pcVar1;
  crcinfo *pcVar2;
  bool bVar3;
  long lVar4;
  crcinfo cVar5;
  crcinfo *pcVar6;
  crcinfo *pcVar7;
  crcinfo pivot;
  crcinfo local_58;
  crcinfo *local_50;
  crcinfo *local_48;
  crcinfo *local_40;
  crcinfo *local_38;
  
  lVar4 = (long)end - (long)start;
  do {
    pcVar2 = start;
    if (lVar4 >> 3 < 0xb) {
      do {
        do {
          pcVar1 = pcVar2;
          pcVar2 = pcVar1 + 1;
          if (end <= pcVar2) {
            return;
          }
          bVar3 = (*fun)(pcVar2,pcVar1);
        } while (!bVar3);
        local_58 = pcVar1[1];
        pcVar1[1] = *pcVar1;
        while (start < pcVar1) {
          bVar3 = (*fun)(&local_58,pcVar1 + -1);
          if (!bVar3) break;
          *pcVar1 = pcVar1[-1];
          pcVar1 = pcVar1 + -1;
        }
        *pcVar1 = local_58;
      } while( true );
    }
    pcVar2 = (crcinfo *)(&start->crc + (lVar4 >> 3 & 0xfffffffffffffffe));
    local_40 = end;
    local_38 = start;
    bVar3 = (*fun)(start,pcVar2);
    pcVar1 = end + -1;
    if (bVar3) {
      bVar3 = (*fun)(pcVar1,start);
      if (bVar3) {
        local_58 = *start;
        *start = *pcVar1;
      }
      else {
        bVar3 = (*fun)(pcVar1,pcVar2);
        if (!bVar3) {
          local_58 = *pcVar2;
          goto LAB_00145368;
        }
        local_58 = *pcVar1;
      }
      cVar5 = *pcVar2;
LAB_00145365:
      *pcVar1 = cVar5;
    }
    else {
      bVar3 = (*fun)(start,pcVar1);
      if (!bVar3) {
        bVar3 = (*fun)(pcVar2,pcVar1);
        if (bVar3) {
          local_58 = *pcVar1;
          *pcVar1 = *start;
          goto LAB_00145341;
        }
        local_58 = *pcVar2;
        cVar5 = *start;
        *start = *pcVar1;
        goto LAB_00145365;
      }
      local_58 = *start;
LAB_00145341:
      *start = *pcVar2;
    }
LAB_00145368:
    pcVar1 = local_38;
    pcVar6 = end + -2;
    *pcVar2 = *pcVar6;
    pcVar2 = start + 1;
    local_50 = start;
    local_48 = end;
    pcVar7 = pcVar6;
    do {
      while (end = pcVar2, bVar3 = (*fun)(end,&local_58), !bVar3) {
        while( true ) {
          pcVar7 = pcVar7 + -1;
          bVar3 = (*fun)(&local_58,pcVar7);
          if (!bVar3) break;
          if (pcVar7 <= end) goto LAB_001453dd;
        }
        cVar5 = *end;
        *end = *pcVar7;
        *pcVar7 = cVar5;
        pcVar2 = end + 1;
        if (pcVar7 <= end + 1) {
          end = end + 1;
          goto LAB_001453dd;
        }
      }
      end = end + 1;
      pcVar2 = end;
    } while (end < pcVar7);
LAB_001453dd:
    *pcVar6 = *end;
    *end = local_58;
    start = end + 1;
    if ((long)end - (long)pcVar1 < (long)local_40 - (long)start) {
      quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                (local_50,end,fun);
      end = local_48;
    }
    else {
      quicksort<server::crcinfo,bool(*)(server::crcinfo_const&,server::crcinfo_const&)>
                (start,local_48,fun);
      start = local_50;
    }
    lVar4 = (long)end - (long)start;
  } while( true );
}

Assistant:

static inline void quicksort(T *start, T *end, F fun)
{
    while(end-start > 10)
    {
        T *mid = &start[(end-start)/2], *i = start+1, *j = end-2, pivot;
        if(fun(*start, *mid)) /* start < mid */
        {
            if(fun(end[-1], *start)) { pivot = *start; *start = end[-1]; end[-1] = *mid; } /* end < start < mid */
            else if(fun(end[-1], *mid)) { pivot = end[-1]; end[-1] = *mid; } /* start <= end < mid */
            else { pivot = *mid; } /* start < mid <= end */
        }
        else if(fun(*start, end[-1])) { pivot = *start; *start = *mid; } /*mid <= start < end */
        else if(fun(*mid, end[-1])) { pivot = end[-1]; end[-1] = *start; *start = *mid; } /* mid < end <= start */
        else { pivot = *mid; swap(*start, end[-1]); }  /* end <= mid <= start */
        *mid = end[-2];
        do
        {
            while(fun(*i, pivot)) if(++i >= j) goto partitioned;
            while(fun(pivot, *--j)) if(i >= j) goto partitioned;
            swap(*i, *j);
        }
        while(++i < j);
    partitioned:
        end[-2] = *i;
        *i = pivot;
        
        if(i-start < end-(i+1))
        {
            quicksort(start, i, fun);
            start = i+1;
        }
        else
        {
            quicksort(i+1, end, fun);
            end = i;
        }
    }
    
    insertionsort(start, end, fun);
}